

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void set_firstpass_encode_done(AV1_COMP *cpi)

{
  BLOCK_SIZE fp_block_size_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TileInfo *tile_00;
  long in_RDI;
  int unit_row_in_tile;
  int mi_row;
  int unit_cols_in_tile;
  AV1EncRowMultiThreadSync *row_mt_sync;
  TileInfo *tile;
  TileDataEnc *tile_data;
  int tile_col;
  int tile_row;
  int unit_height;
  BLOCK_SIZE fp_block_size;
  int tile_rows;
  int tile_cols;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  AV1_COMMON *cm;
  int local_54;
  int local_50;
  int local_30;
  int local_2c;
  
  iVar2 = *(int *)(in_RDI + 0x42020);
  iVar3 = *(int *)(in_RDI + 0x42024);
  fp_block_size_00 = *(BLOCK_SIZE *)(in_RDI + 0x9d514);
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [fp_block_size_00];
  for (local_2c = 0; local_2c < iVar3; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      tile_00 = (TileInfo *)
                (*(long *)(in_RDI + 0x71318) + (long)(local_2c * iVar2 + local_30) * 0x5d10);
      iVar4 = av1_get_unit_cols_in_tile(tile_00,fp_block_size_00);
      local_50 = tile_00->mi_row_start;
      local_54 = 0;
      for (; local_50 < tile_00->mi_row_end; local_50 = (uint)bVar1 + local_50) {
        (**(code **)(in_RDI + 0x9afd0))(&tile_00[0x3de].mi_col_start,local_54,iVar4 + -1,iVar4);
        local_54 = local_54 + 1;
      }
    }
  }
  return;
}

Assistant:

static void set_firstpass_encode_done(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  const int unit_height = mi_size_high[fp_block_size];

  // In case of multithreading of firstpass encode, due to top-right
  // dependency, the worker on a firstpass row waits for the completion of the
  // firstpass processing of the top and top-right fp_blocks. Hence, in case a
  // thread (main/worker) encounters an error, update the firstpass processing
  // of every row in the frame to indicate that it is complete in order to avoid
  // dependent workers waiting indefinitely.
  for (int tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (int tile_col = 0; tile_col < tile_cols; ++tile_col) {
      TileDataEnc *const tile_data =
          &cpi->tile_data[tile_row * tile_cols + tile_col];
      TileInfo *tile = &tile_data->tile_info;
      AV1EncRowMultiThreadSync *const row_mt_sync = &tile_data->row_mt_sync;
      const int unit_cols_in_tile =
          av1_get_unit_cols_in_tile(tile, fp_block_size);
      for (int mi_row = tile->mi_row_start, unit_row_in_tile = 0;
           mi_row < tile->mi_row_end;
           mi_row += unit_height, unit_row_in_tile++) {
        enc_row_mt->sync_write_ptr(row_mt_sync, unit_row_in_tile,
                                   unit_cols_in_tile - 1, unit_cols_in_tile);
      }
    }
  }
}